

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void realize_virt_arrays(j_common_ptr cinfo)

{
  jpeg_memory_mgr *pjVar1;
  long lVar2;
  JBLOCKARRAY ppaJVar3;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *local_50;
  jvirt_barray_ptr bptr;
  jvirt_sarray_ptr sptr;
  long max_minheights;
  long minheights;
  long avail_mem;
  long maximum_space;
  long space_per_minheight;
  my_mem_ptr mem;
  j_common_ptr cinfo_local;
  
  pjVar1 = cinfo->mem;
  maximum_space = 0;
  avail_mem = 0;
  for (bptr = (jvirt_barray_ptr)pjVar1[1].request_virt_sarray; bptr != (jvirt_barray_ptr)0x0;
      bptr = bptr->next) {
    if (bptr->mem_buffer == (JBLOCKARRAY)0x0) {
      maximum_space = (ulong)bptr->maxaccess * (ulong)bptr->blocksperrow + maximum_space;
      avail_mem = (ulong)bptr->rows_in_array * (ulong)bptr->blocksperrow + avail_mem;
    }
  }
  for (local_50 = pjVar1[1].request_virt_barray;
      local_50 !=
      (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
      local_50 = *(_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   **)(local_50 + 0x30)) {
    if (*(long *)local_50 == 0) {
      maximum_space =
           (ulong)*(uint *)(local_50 + 0x10) * (ulong)*(uint *)(local_50 + 0xc) * 0x80 +
           maximum_space;
      avail_mem = (ulong)*(uint *)(local_50 + 8) * (ulong)*(uint *)(local_50 + 0xc) * 0x80 +
                  avail_mem;
    }
  }
  if (0 < maximum_space) {
    lVar2 = jpeg_mem_available(cinfo,maximum_space,avail_mem,(long)pjVar1[1].realize_virt_arrays);
    if (lVar2 < avail_mem) {
      sptr = (jvirt_sarray_ptr)(lVar2 / maximum_space);
      if ((long)sptr < 1) {
        sptr = (jvirt_sarray_ptr)0x1;
      }
    }
    else {
      sptr = (jvirt_sarray_ptr)0x3b9aca00;
    }
    for (bptr = (jvirt_barray_ptr)pjVar1[1].request_virt_sarray; bptr != (jvirt_barray_ptr)0x0;
        bptr = bptr->next) {
      if (bptr->mem_buffer == (JBLOCKARRAY)0x0) {
        if ((long)sptr < (long)((ulong)bptr->rows_in_array - 1) / (long)(ulong)bptr->maxaccess + 1)
        {
          bptr->rows_in_mem = (int)sptr * bptr->maxaccess;
          jpeg_open_backing_store
                    (cinfo,&bptr->b_s_info,(ulong)bptr->rows_in_array * (ulong)bptr->blocksperrow);
          bptr->b_s_open = 1;
        }
        else {
          bptr->rows_in_mem = bptr->rows_in_array;
        }
        ppaJVar3 = (JBLOCKARRAY)alloc_sarray(cinfo,1,bptr->blocksperrow,bptr->rows_in_mem);
        bptr->mem_buffer = ppaJVar3;
        bptr->rowsperchunk = *(JDIMENSION *)&pjVar1[1].access_virt_sarray;
        bptr->cur_start_row = 0;
        bptr->first_undef_row = 0;
        bptr->dirty = 0;
      }
    }
    for (local_50 = pjVar1[1].request_virt_barray;
        local_50 !=
        (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
        local_50 = *(_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                     **)(local_50 + 0x30)) {
      if (*(long *)local_50 == 0) {
        if ((long)sptr <
            (long)((ulong)*(uint *)(local_50 + 8) - 1) / (long)(ulong)*(uint *)(local_50 + 0x10) + 1
           ) {
          *(int *)(local_50 + 0x14) = (int)sptr * *(int *)(local_50 + 0x10);
          jpeg_open_backing_store
                    (cinfo,(backing_store_ptr)(local_50 + 0x38),
                     (ulong)*(uint *)(local_50 + 8) * (ulong)*(uint *)(local_50 + 0xc) * 0x80);
          *(undefined4 *)(local_50 + 0x2c) = 1;
        }
        else {
          *(undefined4 *)(local_50 + 0x14) = *(undefined4 *)(local_50 + 8);
        }
        ppaJVar3 = alloc_barray(cinfo,1,*(JDIMENSION *)(local_50 + 0xc),
                                *(JDIMENSION *)(local_50 + 0x14));
        *(JBLOCKARRAY *)local_50 = ppaJVar3;
        *(undefined4 *)(local_50 + 0x18) = *(undefined4 *)&pjVar1[1].access_virt_sarray;
        *(undefined4 *)(local_50 + 0x1c) = 0;
        *(undefined4 *)(local_50 + 0x20) = 0;
        *(undefined4 *)(local_50 + 0x28) = 0;
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
realize_virt_arrays (j_common_ptr cinfo)
/* Allocate the in-memory buffers for any unrealized virtual arrays */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  long space_per_minheight, maximum_space, avail_mem;
  long minheights, max_minheights;
  jvirt_sarray_ptr sptr;
  jvirt_barray_ptr bptr;

  /* Compute the minimum space needed (maxaccess rows in each buffer)
   * and the maximum space needed (full image height in each buffer).
   * These may be of use to the system-dependent jpeg_mem_available routine.
   */
  space_per_minheight = 0;
  maximum_space = 0;
  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      space_per_minheight += (long) sptr->maxaccess *
			     (long) sptr->samplesperrow * SIZEOF(JSAMPLE);
      maximum_space += (long) sptr->rows_in_array *
		       (long) sptr->samplesperrow * SIZEOF(JSAMPLE);
    }
  }
  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      space_per_minheight += (long) bptr->maxaccess *
			     (long) bptr->blocksperrow * SIZEOF(JBLOCK);
      maximum_space += (long) bptr->rows_in_array *
		       (long) bptr->blocksperrow * SIZEOF(JBLOCK);
    }
  }

  if (space_per_minheight <= 0)
    return;			/* no unrealized arrays, no work */

  /* Determine amount of memory to actually use; this is system-dependent. */
  avail_mem = jpeg_mem_available(cinfo, space_per_minheight, maximum_space,
				 mem->total_space_allocated);

  /* If the maximum space needed is available, make all the buffers full
   * height; otherwise parcel it out with the same number of minheights
   * in each buffer.
   */
  if (avail_mem >= maximum_space)
    max_minheights = 1000000000L;
  else {
    max_minheights = avail_mem / space_per_minheight;
    /* If there doesn't seem to be enough space, try to get the minimum
     * anyway.  This allows a "stub" implementation of jpeg_mem_available().
     */
    if (max_minheights <= 0)
      max_minheights = 1;
  }

  /* Allocate the in-memory buffers and initialize backing store as needed. */

  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long) sptr->rows_in_array - 1L) / sptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
	/* This buffer fits in memory */
	sptr->rows_in_mem = sptr->rows_in_array;
      } else {
	/* It doesn't fit in memory, create backing store. */
	sptr->rows_in_mem = (JDIMENSION) (max_minheights * sptr->maxaccess);
	jpeg_open_backing_store(cinfo, & sptr->b_s_info,
				(long) sptr->rows_in_array *
				(long) sptr->samplesperrow *
				(long) SIZEOF(JSAMPLE));
	sptr->b_s_open = TRUE;
      }
      sptr->mem_buffer = alloc_sarray(cinfo, JPOOL_IMAGE,
				      sptr->samplesperrow, sptr->rows_in_mem);
      sptr->rowsperchunk = mem->last_rowsperchunk;
      sptr->cur_start_row = 0;
      sptr->first_undef_row = 0;
      sptr->dirty = FALSE;
    }
  }

  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long) bptr->rows_in_array - 1L) / bptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
	/* This buffer fits in memory */
	bptr->rows_in_mem = bptr->rows_in_array;
      } else {
	/* It doesn't fit in memory, create backing store. */
	bptr->rows_in_mem = (JDIMENSION) (max_minheights * bptr->maxaccess);
	jpeg_open_backing_store(cinfo, & bptr->b_s_info,
				(long) bptr->rows_in_array *
				(long) bptr->blocksperrow *
				(long) SIZEOF(JBLOCK));
	bptr->b_s_open = TRUE;
      }
      bptr->mem_buffer = alloc_barray(cinfo, JPOOL_IMAGE,
				      bptr->blocksperrow, bptr->rows_in_mem);
      bptr->rowsperchunk = mem->last_rowsperchunk;
      bptr->cur_start_row = 0;
      bptr->first_undef_row = 0;
      bptr->dirty = FALSE;
    }
  }
}